

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4280d61::DumpVisitor::onStartCompileUnit(DumpVisitor *this,Unit *CU)

{
  undefined2 uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  Data *__n;
  size_t __n_00;
  void *__buf;
  raw_ostream *prVar4;
  uint local_30;
  uint local_2c;
  ushort local_26;
  uint8_t local_23;
  uint8_t local_22;
  UnitType local_21;
  
  writeInitialLength(&CU->Length,this->OS,
                     ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                     DebugInfo)->IsLittleEndian);
  prVar4 = this->OS;
  iVar3 = (*prVar4->_vptr_raw_ostream[9])(prVar4);
  this->StartPos =
       (size_t)(prVar4->OutBufCur + (CONCAT44(extraout_var,iVar3) - (long)prVar4->OutBufStart));
  uVar1 = CU->Version;
  __n = (this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo;
  local_26 = uVar1 << 8 | (ushort)uVar1 >> 8;
  if (__n->IsLittleEndian != false) {
    local_26 = uVar1;
  }
  llvm::raw_ostream::write(this->OS,(int)&local_26,(void *)0x2,(size_t)__n);
  if (CU->Version < 5) {
    uVar2 = CU->AbbrOffset;
    local_30 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
        IsLittleEndian != false) {
      local_30 = uVar2;
    }
    __n_00 = (size_t)local_30;
    llvm::raw_ostream::write(this->OS,(int)&local_30,(void *)0x4,__n_00);
    local_23 = CU->AddrSize;
    prVar4 = this->OS;
    iVar3 = (int)&local_23;
    __buf = (void *)0x1;
  }
  else {
    local_21 = CU->Type;
    llvm::raw_ostream::write(this->OS,(int)&local_21,(void *)0x1,(size_t)__n);
    local_22 = CU->AddrSize;
    llvm::raw_ostream::write(this->OS,(int)&local_22,(void *)0x1,(size_t)__n);
    uVar2 = CU->AbbrOffset;
    prVar4 = this->OS;
    local_2c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
        IsLittleEndian != false) {
      local_2c = uVar2;
    }
    __n_00 = (size_t)local_2c;
    iVar3 = (int)&local_2c;
    __buf = (void *)0x4;
  }
  llvm::raw_ostream::write(prVar4,iVar3,__buf,__n_00);
  return;
}

Assistant:

void onStartCompileUnit(const DWARFYAML::Unit &CU) override {
    writeInitialLength(CU.Length, OS, DebugInfo.IsLittleEndian);
    StartPos = OS.tell(); // XXX BINARYEN
    writeInteger((uint16_t)CU.Version, OS, DebugInfo.IsLittleEndian);
    if(CU.Version >= 5) {
      writeInteger((uint8_t)CU.Type, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
    }else {
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
    }
  }